

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testGenerator.h
# Opt level: O1

void generateHeaps(int size,int heapNumber,HeapList *heaps,vector<int,_std::allocator<int>_> *order,
                  vector<int,_std::allocator<int>_> *values)

{
  IHeap *pIVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  uVar2 = heapNumber;
  if (size < heapNumber) {
    uVar2 = size;
  }
  if (0 < (int)uVar2) {
    uVar4 = 0;
    do {
      HeapList::AddHeap(heaps,(values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[uVar4]);
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  iVar3 = size - heapNumber;
  if (iVar3 != 0 && heapNumber <= size) {
    lVar5 = (long)heapNumber;
    do {
      pIVar1 = (heaps->list_).super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
               super__Vector_impl_data._M_start
               [(order->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar5]];
      (**pIVar1->_vptr_IHeap)
                (pIVar1,(ulong)(uint)(values->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                     .super__Vector_impl_data._M_start[lVar5]);
      lVar5 = lVar5 + 1;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

void generateHeaps(int size, int heapNumber, HeapList& heaps, std::vector<int>& order, std::vector<int>& values) {

    for (int i = 0; i < std::min(heapNumber, size); i++)
        heaps.AddHeap(values[i]);

    for (int i = std::min(heapNumber, size); i < size; i++)
        heaps.Insert(order[i], values[i]);
}